

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O0

void ImGuiStb::stb_textedit_move_to_last(ImGuiTextEditState *str,STB_TexteditState *state)

{
  STB_TexteditState *state_local;
  ImGuiTextEditState *str_local;
  
  if (state->select_start != state->select_end) {
    stb_textedit_sortselection(state);
    stb_textedit_clamp(str,state);
    state->cursor = state->select_end;
    state->select_start = state->select_end;
    state->has_preferred_x = '\0';
  }
  return;
}

Assistant:

static void stb_textedit_move_to_last(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   if (STB_TEXT_HAS_SELECTION(state)) {
      stb_textedit_sortselection(state);
      stb_textedit_clamp(str, state);
      state->cursor = state->select_end;
      state->select_start = state->select_end;
      state->has_preferred_x = 0;
   }
}